

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

void Llb_Nonlin4CreateOrder_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vOrder,int *pCounter)

{
  int Entry;
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_01;
  
  if (pObj->TravId == pAig->nTravIds) {
    return;
  }
  pObj->TravId = pAig->nTravIds;
  iVar1 = Llb_ObjBddVar(vOrder,pObj);
  if (iVar1 < 0) {
    if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
      pObj_00 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      pAVar2 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      pObj_01 = pAVar2;
      if ((*(uint *)&pObj_00->field_0x1c & 0xffffff) <= (*(uint *)&pAVar2->field_0x1c & 0xffffff)) {
        pObj_01 = pObj_00;
        pObj_00 = pAVar2;
      }
      Llb_Nonlin4CreateOrder_rec(pAig,pObj_00,vOrder,pCounter);
      Llb_Nonlin4CreateOrder_rec(pAig,pObj_01,vOrder,pCounter);
      if ((pObj->field_0x18 & 0x10) == 0) {
        return;
      }
    }
    iVar1 = pObj->Id;
    Entry = *pCounter;
    *pCounter = Entry + 1;
    Vec_IntWriteEntry(vOrder,iVar1,Entry);
    return;
  }
  __assert_fail("Llb_ObjBddVar(vOrder, pObj) < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Nonlin.c"
                ,0x115,
                "void Llb_Nonlin4CreateOrder_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int *)");
}

Assistant:

void Llb_Nonlin4CreateOrder_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vOrder, int * pCounter )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent( pAig, pObj );
    assert( Llb_ObjBddVar(vOrder, pObj) < 0 );
    if ( Aig_ObjIsCi(pObj) )
    {
//        if ( Saig_ObjIsLo(pAig, pObj) )
//            Vec_IntWriteEntry( vOrder, Aig_ObjId(Saig_ObjLoToLi(pAig, pObj)), (*pCounter)++ );
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), (*pCounter)++ );
        return;
    }
    // try fanins with higher level first
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);
//    if ( pFanin0->Level > pFanin1->Level || (pFanin0->Level == pFanin1->Level && pFanin0->Id < pFanin1->Id) )
    if ( pFanin0->Level > pFanin1->Level )
    {
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin0, vOrder, pCounter );
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin1, vOrder, pCounter );
    }
    else
    {
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin1, vOrder, pCounter );
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin0, vOrder, pCounter );
    }
    if ( pObj->fMarkA )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), (*pCounter)++ );
}